

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  byte bVar3;
  byte bVar4;
  ImGuiContext *g;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float extraout_XMM0_Db;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar15;
  float fVar16;
  undefined1 auVar13 [16];
  float fVar17;
  undefined1 auVar14 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float local_38;
  float fStack_34;
  
  pIVar2 = GImGui;
  fVar8 = 0.0;
  if ((window->Flags & 1) == 0) {
    fVar8 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar8 = fVar8 * window->ParentWindow->FontWindowScale;
    }
    fVar21 = (GImGui->Style).FramePadding.y;
    fVar8 = fVar21 + fVar21 + fVar8;
  }
  fVar9 = ImGuiWindow::MenuBarHeight(window);
  fVar21 = (window->WindowPadding).x;
  fVar21 = fVar21 + fVar21;
  fVar18 = (window->WindowPadding).y;
  fVar18 = fVar18 + fVar18;
  local_38 = size_contents->x + fVar21;
  fStack_34 = fVar9 + fVar8 + size_contents->y + fVar18;
  fVar24 = extraout_XMM0_Db + 0.0;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    auVar13._8_8_ = 0;
    auVar13._0_4_ = (pIVar2->Style).WindowMinSize.x;
    auVar13._4_4_ = (pIVar2->Style).WindowMinSize.y;
    IVar10 = (pIVar2->Style).DisplaySafeAreaPadding;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar13 = minps(auVar13,_DAT_00166ff0);
    }
    IVar1 = ((*(GImGui->Viewports).Data)->super_ImGuiViewport).Size;
    fVar15 = IVar10.x;
    fVar12 = IVar10.y;
    fVar19 = IVar1.x - (fVar15 + fVar15);
    fVar20 = IVar1.y - (fVar12 + fVar12);
    fVar12 = auVar13._0_4_;
    fVar15 = auVar13._4_4_;
    fVar16 = auVar13._8_4_;
    fVar17 = auVar13._12_4_;
    uVar5 = -(uint)(fVar19 <= fVar12);
    uVar6 = -(uint)(fVar20 <= fVar15);
    fVar22 = (float)((uint)fVar16 & -(uint)(0.0 <= fVar16));
    fVar23 = (float)((uint)fVar17 & -(uint)(0.0 <= fVar17));
    fVar19 = (float)(~uVar5 & (uint)fVar19 | (uint)fVar12 & uVar5);
    fVar20 = (float)(~uVar6 & (uint)fVar20 | (uint)fVar15 & uVar6);
    uVar5 = -(uint)(fVar19 < local_38);
    uVar6 = -(uint)(fVar20 < fStack_34);
    uVar7 = -(uint)(fVar23 < fVar24);
    auVar14._0_4_ = (uint)fVar12 & -(uint)(local_38 < fVar12);
    auVar14._4_4_ = (uint)fVar15 & -(uint)(fStack_34 < fVar15);
    auVar14._8_4_ = (uint)fVar16 & -(uint)(0.0 < fVar16);
    auVar14._12_4_ = (uint)fVar17 & -(uint)(fVar24 < fVar17);
    auVar11._0_4_ =
         ~-(uint)(local_38 < fVar12) & (~uVar5 & (uint)(local_38 + 0.0) | (uint)fVar19 & uVar5);
    auVar11._4_4_ = ~-(uint)(fStack_34 < fVar15) & (~uVar6 & (uint)fStack_34 | (uint)fVar20 & uVar6)
    ;
    auVar11._8_4_ = ~-(uint)(0.0 < fVar16) & (uint)fVar22 & -(uint)(fVar22 < 0.0);
    auVar11._12_4_ = ~-(uint)(fVar24 < fVar17) & (~uVar7 & (uint)fVar24 | (uint)fVar23 & uVar7);
    auVar11 = auVar11 | auVar14;
    IVar10 = CalcWindowSizeAfterConstraint(window,auVar11._0_8_);
    if ((size_contents->x <= IVar10.x - fVar21) || (bVar3 = 1, (window->Flags & 0x808U) != 0x800)) {
      bVar3 = *(byte *)((long)&window->Flags + 1) >> 7;
    }
    if ((size_contents->y <= (IVar10.y - fVar18) - (fVar9 + fVar8)) ||
       (bVar4 = 1, (window->Flags & 8) != 0)) {
      bVar4 = (*(byte *)((long)&window->Flags + 1) & 0x40) >> 6;
    }
    local_38 = auVar11._0_4_;
    fStack_34 = auVar11._4_4_;
    if (bVar3 != 0) {
      fStack_34 = fStack_34 + (pIVar2->Style).ScrollbarSize;
    }
    if (bVar4 != 0) {
      local_38 = local_38 + (pIVar2->Style).ScrollbarSize;
    }
  }
  else {
    local_38 = local_38 + 0.0;
  }
  IVar10.y = fStack_34;
  IVar10.x = local_38;
  return IVar10;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = ImGui::GetMainViewport()->Size;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}